

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

void __thiscall cmCTestHG::LogParser::~LogParser(LogParser *this)

{
  (this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_0066b158;
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__LogParser_0066b1a8;
  cmXMLParser::CleanupParser(&this->super_cmXMLParser);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->CData).super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&(this->CurChange).Path);
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
            (&this->Changes);
  cmCTestVC::Revision::~Revision(&this->Rev);
  cmXMLParser::~cmXMLParser(&this->super_cmXMLParser);
  cmProcessTools::LineParser::~LineParser((LineParser *)this);
  return;
}

Assistant:

~LogParser() { this->CleanupParser(); }